

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* get_reference_map(string *reference)

{
  undefined8 __s;
  byte bVar1;
  int iVar2;
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  string local_3a8 [32];
  _Base_ptr local_388;
  undefined1 local_380;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  allocator<char> local_331;
  string local_330;
  string local_310;
  undefined8 local_2f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  undefined8 local_2e0;
  char local_2d1;
  char *local_2d0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  undefined8 local_2b8;
  allocator<char> local_2a9;
  string local_2a8 [8];
  string buff_string;
  undefined1 local_280 [6];
  bool first;
  string current_chr;
  char *buffer;
  allocator<char> local_241;
  undefined1 local_240 [8];
  string tmp_str;
  ifstream ref_handle;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ref;
  string *reference_local;
  
  this = (map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          *)operator_new(0x30);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)this);
  std::ifstream::ifstream((void *)((long)&tmp_str.field_2 + 8),(string *)reference,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_240,"",&local_241);
  std::allocator<char>::~allocator(&local_241);
  current_chr.field_2._8_8_ = calloc(0x400,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_280,"",(allocator<char> *)(buff_string.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(buff_string.field_2._M_local_buf + 0xf));
  buff_string.field_2._M_local_buf[0xe] = '\x01';
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      std::istream::getline(tmp_str.field_2._M_local_buf + 8,current_chr.field_2._8_8_);
      bVar1 = std::ios::eof();
      __s = current_chr.field_2._8_8_;
      if ((bVar1 & 1) != 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2a8,(char *)__s,&local_2a9);
      std::allocator<char>::~allocator(&local_2a9);
      local_2c8._M_current = (char *)std::__cxx11::string::begin();
      local_2d0 = (char *)std::__cxx11::string::end();
      local_2d1 = '\n';
      local_2c0 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                            (local_2c8,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_2d0,&local_2d1);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2b8,&local_2c0);
      local_2e8._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2e0,&local_2e8);
      local_2f0 = std::__cxx11::string::erase(local_2a8,local_2b8,local_2e0);
      std::__cxx11::string::string((string *)&local_310,local_2a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,">",&local_331);
      iVar2 = startsWith(&local_310,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      std::__cxx11::string::~string((string *)&local_310);
      if (iVar2 == 0) {
        std::__cxx11::string::operator+=((string *)local_240,local_2a8);
      }
      else {
        if ((buff_string.field_2._M_local_buf[0xe] & 1U) == 0) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240)
          ;
          _Var3 = std::
                  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>(this,&local_378);
          local_388 = (_Base_ptr)_Var3.first._M_node;
          local_380 = _Var3.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_378);
        }
        else {
          buff_string.field_2._M_local_buf[0xe] = '\0';
        }
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_3a8,(ulong)local_2a8);
        std::__cxx11::string::operator=((string *)local_280,local_3a8);
        std::__cxx11::string::~string(local_3a8);
        std::__cxx11::string::operator=((string *)local_240,"");
      }
      std::__cxx11::string::~string(local_2a8);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_3e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>(this,&local_3e8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_3e8);
    std::ifstream::close();
  }
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string((string *)local_240);
  std::ifstream::~ifstream((void *)((long)&tmp_str.field_2 + 8));
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)this;
}

Assistant:

map<string,string> * get_reference_map(string reference){
    map<string,string> * ref = new map<string,string>();
    ifstream ref_handle (reference );
    string tmp_str="";
    char * buffer =  (char *)calloc(1024,sizeof(char));
    string current_chr = "";
    bool first = true;
    if (ref_handle.is_open()){
        while(1){
            ref_handle.getline(buffer,1024);
            if(!ref_handle.eof()){
                string buff_string(buffer);
                buff_string.erase(std::remove(buff_string.begin(), buff_string.end(), '\n'), buff_string.end());
                if (startsWith(buff_string,string(">"))) {
                    if (!first){
                        ref->insert ( std::pair<string,string>(current_chr,tmp_str) );
                    }else{
                        first = false;
                    }
                    current_chr =  buff_string.substr(1, buff_string.length() - 1);
                    tmp_str = "";
                }else{
                    tmp_str += buff_string;
                }
            }else{
                break;
            }
        }
        ref->insert ( std::pair<string,string>(current_chr,tmp_str) );
        ref_handle.close();

    }

    return ref;
}